

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fra.h
# Opt level: O1

int Fra_OneHotNodesAreClause
              (Fra_Sml_t *pSeq,Aig_Obj_t *pObj1,Aig_Obj_t *pObj2,int fCompl1,int fCompl2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = pSeq->nWordsTotal;
  lVar4 = (long)(pObj1->Id * iVar1);
  lVar3 = (long)(pObj2->Id * iVar1);
  if (fCompl2 == 0 || fCompl1 == 0) {
    if (fCompl1 == 0) {
      if (fCompl2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                      ,0x77,
                      "int Fra_OneHotNodesAreClause(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                     );
      }
      iVar2 = pSeq->nWordsPref;
      if (iVar2 < iVar1) {
        lVar5 = 0;
        do {
          if ((*(uint *)((long)&pSeq[1].pAig + lVar5 * 4 + lVar3 * 4 + (long)iVar2 * 4) &
              ~*(uint *)((long)&pSeq[1].pAig + lVar5 * 4 + lVar4 * 4 + (long)iVar2 * 4)) != 0) {
            return 0;
          }
          lVar5 = lVar5 + 1;
        } while (iVar1 - iVar2 != (int)lVar5);
      }
    }
    else {
      iVar2 = pSeq->nWordsPref;
      if (iVar2 < iVar1) {
        lVar5 = 0;
        do {
          if ((*(uint *)((long)&pSeq[1].pAig + lVar5 * 4 + lVar4 * 4 + (long)iVar2 * 4) &
              ~*(uint *)((long)&pSeq[1].pAig + lVar5 * 4 + lVar3 * 4 + (long)iVar2 * 4)) != 0) {
            return 0;
          }
          lVar5 = lVar5 + 1;
        } while (iVar1 - iVar2 != (int)lVar5);
      }
    }
  }
  else {
    iVar2 = pSeq->nWordsPref;
    if (iVar2 < iVar1) {
      lVar5 = 0;
      do {
        if ((*(uint *)((long)&pSeq[1].pAig + lVar5 * 4 + lVar4 * 4 + (long)iVar2 * 4) &
            *(uint *)((long)&pSeq[1].pAig + lVar5 * 4 + lVar3 * 4 + (long)iVar2 * 4)) != 0) {
          return 0;
        }
        lVar5 = lVar5 + 1;
      } while (iVar1 - iVar2 != (int)lVar5);
    }
  }
  return 1;
}

Assistant:

static inline unsigned *   Fra_ObjSim( Fra_Sml_t * p, int Id )                           { return p->pData + p->nWordsTotal * Id; }